

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O0

int WebPWriteTIFF(FILE *fout,WebPDecBuffer *buffer)

{
  int iVar1;
  size_t sVar2;
  WEBP_CSP_MODE *in_RSI;
  FILE *in_RDI;
  uint32_t y;
  uint8_t tiff_header [210];
  uint8_t num_ifd_entries;
  uint8_t assoc_alpha;
  uint8_t bytes_per_px;
  int stride;
  uint8_t *rgba;
  uint32_t height;
  uint32_t width;
  int has_alpha;
  uint32_t in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  WEBP_CSP_MODE WVar3;
  undefined1 local_118;
  undefined1 local_117;
  undefined1 local_116;
  undefined1 local_115;
  undefined1 local_114;
  undefined1 local_113;
  undefined1 local_112;
  undefined1 local_111;
  undefined1 local_110;
  undefined1 local_10f;
  undefined1 local_10e;
  undefined1 local_10d;
  undefined1 local_10c;
  undefined1 local_10b;
  undefined1 local_10a;
  undefined1 local_109;
  undefined1 local_108;
  undefined1 local_107;
  undefined1 local_106;
  undefined1 local_105;
  undefined1 local_104;
  undefined1 local_103;
  undefined1 local_102;
  undefined1 local_101;
  undefined1 local_100;
  undefined1 local_ff;
  undefined1 local_fe;
  undefined1 local_fd;
  undefined1 local_fc;
  undefined1 local_fb;
  undefined1 local_fa;
  undefined1 local_f9;
  undefined1 local_f8;
  undefined1 local_f7;
  undefined1 local_f6;
  undefined1 local_f5;
  undefined1 local_f4;
  undefined1 local_f3;
  byte local_f2;
  undefined1 local_f1;
  undefined1 local_f0;
  undefined1 local_ef;
  undefined1 local_ee;
  undefined1 local_ed;
  undefined1 local_ec;
  undefined1 local_eb;
  undefined1 local_ea;
  undefined1 local_e9;
  undefined1 local_e8;
  undefined1 local_e7;
  undefined1 local_e6;
  undefined1 local_e5;
  undefined1 local_e4;
  undefined1 local_e3;
  undefined1 local_e2;
  undefined1 local_e1;
  undefined1 local_e0;
  undefined1 local_df;
  undefined1 local_de;
  undefined1 local_dd;
  undefined1 local_dc;
  undefined1 local_db;
  undefined1 local_da;
  undefined1 local_d9;
  undefined1 local_d8;
  undefined1 local_d7;
  undefined1 local_d6;
  undefined1 local_d5;
  undefined1 local_d4;
  undefined1 local_d3;
  undefined1 local_d2;
  undefined1 local_d1;
  undefined1 local_d0;
  undefined1 local_cf;
  undefined1 local_ce;
  undefined1 local_cd;
  undefined1 local_cc;
  undefined1 local_cb;
  undefined1 local_ca;
  undefined1 local_c9;
  undefined1 local_c8;
  undefined1 local_c7;
  undefined1 local_c6;
  undefined1 local_c5;
  undefined1 local_c4;
  undefined1 local_c3;
  undefined1 local_c2;
  undefined1 local_c1;
  undefined1 local_c0;
  undefined1 local_bf;
  undefined1 local_be;
  undefined1 local_bd;
  undefined1 local_bc;
  undefined1 local_bb;
  undefined1 local_ba;
  undefined1 local_b9;
  undefined1 local_b8;
  undefined1 local_b7;
  undefined1 local_b6;
  undefined1 local_b5;
  undefined1 local_b4;
  undefined1 local_b3;
  byte local_b2;
  undefined1 local_b1;
  undefined1 local_b0;
  undefined1 local_af;
  undefined1 local_ae;
  undefined1 local_ad;
  undefined1 local_ac;
  undefined1 local_ab;
  undefined1 local_aa;
  undefined1 local_a9;
  undefined1 local_a8;
  undefined1 local_a7;
  undefined1 local_a6;
  undefined1 local_a5;
  undefined1 local_a4;
  undefined1 local_a3;
  undefined1 local_a2;
  undefined1 local_a1;
  undefined1 local_a0;
  undefined1 local_9f;
  undefined1 local_9e;
  undefined1 local_9d;
  undefined1 local_9c;
  undefined1 local_9b;
  undefined1 local_9a;
  undefined1 local_99;
  undefined1 local_98;
  undefined1 local_97;
  undefined1 local_96;
  undefined1 local_95;
  undefined1 local_94;
  undefined1 local_93;
  undefined1 local_92;
  undefined1 local_91;
  undefined1 local_90;
  undefined1 local_8f;
  undefined1 local_8e;
  undefined1 local_8d;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined1 local_8a;
  undefined1 local_89;
  undefined1 local_88;
  undefined1 local_87;
  undefined1 local_86;
  undefined1 local_85;
  undefined1 local_84;
  undefined1 local_83;
  undefined1 local_82;
  undefined1 local_81;
  undefined1 local_80;
  undefined1 local_7f;
  undefined1 local_7e;
  undefined1 local_7d;
  undefined1 local_7c;
  undefined1 local_7b;
  undefined1 local_7a;
  undefined1 local_79;
  undefined1 local_78;
  undefined1 local_77;
  undefined1 local_76;
  undefined1 local_75;
  undefined1 local_74;
  undefined1 local_73;
  undefined1 local_72;
  undefined1 local_71;
  undefined1 local_70;
  undefined1 local_6f;
  undefined1 local_6e;
  undefined1 local_6d;
  undefined1 local_6c;
  undefined1 local_6b;
  undefined1 local_6a;
  undefined1 local_69;
  undefined1 local_68;
  undefined1 local_67;
  undefined1 local_66;
  undefined1 local_65;
  undefined1 local_64;
  undefined1 local_63;
  undefined1 local_62;
  undefined1 local_61;
  undefined1 local_60;
  undefined1 local_5f;
  undefined1 local_5e;
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  undefined1 local_58;
  undefined1 local_57;
  undefined1 local_56;
  undefined1 local_55;
  undefined1 local_54;
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  undefined1 local_48;
  undefined1 local_47;
  undefined1 local_37;
  undefined1 local_36;
  byte local_35;
  WEBP_CSP_MODE local_34;
  void *local_30;
  WEBP_CSP_MODE local_24;
  WEBP_CSP_MODE local_20;
  int local_1c;
  WEBP_CSP_MODE *local_18;
  FILE *local_10;
  int local_4;
  
  local_35 = 0;
  local_36 = 0;
  local_37 = 0;
  local_118 = 0x49;
  local_117 = 0x49;
  local_116 = 0x2a;
  local_115 = 0;
  local_114 = 8;
  local_113 = 0;
  local_112 = 0;
  local_111 = 0;
  local_110 = 0;
  local_10f = 0;
  local_10e = 0;
  local_10d = 1;
  local_10c = 3;
  local_10b = 0;
  local_10a = 1;
  local_109 = 0;
  local_108 = 0;
  local_107 = 0;
  local_106 = 0;
  local_105 = 0;
  local_104 = 0;
  local_103 = 0;
  local_102 = 1;
  local_101 = 1;
  local_100 = 3;
  local_ff = 0;
  local_fe = 1;
  local_fd = 0;
  local_fc = 0;
  local_fb = 0;
  local_fa = 0;
  local_f9 = 0;
  local_f8 = 0;
  local_f7 = 0;
  local_f6 = 2;
  local_f5 = 1;
  local_f4 = 3;
  local_f3 = 0;
  local_f2 = 0;
  local_f1 = 0;
  local_f0 = 0;
  local_ef = 0;
  local_ee = 0xc2;
  local_ed = 0;
  local_ec = 0;
  local_eb = 0;
  local_ea = 3;
  local_e9 = 1;
  local_e8 = 3;
  local_e7 = 0;
  local_e6 = 1;
  local_e5 = 0;
  local_e4 = 0;
  local_e3 = 0;
  local_e2 = 1;
  local_e1 = 0;
  local_e0 = 0;
  local_df = 0;
  local_de = 6;
  local_dd = 1;
  local_dc = 3;
  local_db = 0;
  local_da = 1;
  local_d9 = 0;
  local_d8 = 0;
  local_d7 = 0;
  local_d6 = 2;
  local_d5 = 0;
  local_d4 = 0;
  local_d3 = 0;
  local_d2 = 0x11;
  local_d1 = 1;
  local_d0 = 4;
  local_cf = 0;
  local_ce = 1;
  local_cd = 0;
  local_cc = 0;
  local_cb = 0;
  local_ca = 0xd2;
  local_c9 = 0;
  local_c8 = 0;
  local_c7 = 0;
  local_c6 = 0x12;
  local_c5 = 1;
  local_c4 = 3;
  local_c3 = 0;
  local_c2 = 1;
  local_c1 = 0;
  local_c0 = 0;
  local_bf = 0;
  local_be = 1;
  local_bd = 0;
  local_bc = 0;
  local_bb = 0;
  local_ba = 0x15;
  local_b9 = 1;
  local_b8 = 3;
  local_b7 = 0;
  local_b6 = 1;
  local_b5 = 0;
  local_b4 = 0;
  local_b3 = 0;
  local_b2 = 0;
  local_b1 = 0;
  local_b0 = 0;
  local_af = 0;
  local_ae = 0x16;
  local_ad = 1;
  local_ac = 3;
  local_ab = 0;
  local_aa = 1;
  local_a9 = 0;
  local_a8 = 0;
  local_a7 = 0;
  local_a6 = 0;
  local_a5 = 0;
  local_a4 = 0;
  local_a3 = 0;
  local_a2 = 0x17;
  local_a1 = 1;
  local_a0 = 4;
  local_9f = 0;
  local_9e = 1;
  local_9d = 0;
  local_9c = 0;
  local_9b = 0;
  local_9a = 0;
  local_99 = 0;
  local_98 = 0;
  local_97 = 0;
  local_96 = 0x1a;
  local_95 = 1;
  local_94 = 5;
  local_93 = 0;
  local_92 = 1;
  local_91 = 0;
  local_90 = 0;
  local_8f = 0;
  local_8e = 0xca;
  local_8d = 0;
  local_8c = 0;
  local_8b = 0;
  local_8a = 0x1b;
  local_89 = 1;
  local_88 = 5;
  local_87 = 0;
  local_86 = 1;
  local_85 = 0;
  local_84 = 0;
  local_83 = 0;
  local_82 = 0xca;
  local_81 = 0;
  local_80 = 0;
  local_7f = 0;
  local_7e = 0x1c;
  local_7d = 1;
  local_7c = 3;
  local_7b = 0;
  local_7a = 1;
  local_79 = 0;
  local_78 = 0;
  local_77 = 0;
  local_76 = 1;
  local_75 = 0;
  local_74 = 0;
  local_73 = 0;
  local_72 = 0x28;
  local_71 = 1;
  local_70 = 3;
  local_6f = 0;
  local_6e = 1;
  local_6d = 0;
  local_6c = 0;
  local_6b = 0;
  local_6a = 2;
  local_69 = 0;
  local_68 = 0;
  local_67 = 0;
  local_66 = 0x52;
  local_65 = 1;
  local_64 = 3;
  local_63 = 0;
  local_62 = 1;
  local_61 = 0;
  local_60 = 0;
  local_5f = 0;
  local_5e = 0;
  local_5d = 0;
  local_5c = 0;
  local_5b = 0;
  local_5a = 0;
  local_59 = 0;
  local_58 = 0;
  local_57 = 0;
  local_56 = 8;
  local_55 = 0;
  local_54 = 8;
  local_53 = 0;
  local_52 = 8;
  local_51 = 0;
  local_50 = 8;
  local_4f = 0;
  local_4e = 0x48;
  local_4d = 0;
  local_4c = 0;
  local_4b = 0;
  local_4a = 1;
  local_49 = 0;
  local_48 = 0;
  local_47 = 0;
  if ((in_RDI == (FILE *)0x0) || (in_RSI == (WEBP_CSP_MODE *)0x0)) {
    local_4 = 0;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_1c = WebPIsAlphaMode(MODE_RGB);
    local_20 = local_18[1];
    local_24 = local_18[2];
    local_30 = *(void **)(local_18 + 4);
    local_34 = local_18[6];
    if (local_30 == (void *)0x0) {
      local_4 = 0;
    }
    else {
      local_f2 = 3;
      if (local_1c != 0) {
        local_f2 = 4;
      }
      local_110 = 0xe;
      if (local_1c != 0) {
        local_110 = 0xf;
      }
      local_b2 = local_f2;
      local_35 = local_f2;
      iVar1 = WebPIsPremultipliedMode(*local_18);
      local_5e = 2;
      if (iVar1 != 0) {
        local_5e = 1;
      }
      PutLE32((uint8_t *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
              in_stack_fffffffffffffedc);
      PutLE32((uint8_t *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
              in_stack_fffffffffffffedc);
      PutLE32((uint8_t *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
              in_stack_fffffffffffffedc);
      PutLE32((uint8_t *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
              in_stack_fffffffffffffedc);
      if (local_1c == 0) {
        PutLE32((uint8_t *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                in_stack_fffffffffffffedc);
      }
      sVar2 = fwrite(&local_118,0xd2,1,local_10);
      if (sVar2 == 1) {
        for (WVar3 = MODE_RGB; WVar3 < local_24; WVar3 = WVar3 + MODE_RGBA) {
          sVar2 = fwrite(local_30,(ulong)local_35,(ulong)local_20,local_10);
          if (sVar2 != local_20) {
            return 0;
          }
          local_30 = (void *)((long)local_30 + (long)(int)local_34);
        }
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int WebPWriteTIFF(FILE* fout, const WebPDecBuffer* const buffer) {
  int has_alpha;
  uint32_t width, height;
  uint8_t* rgba;
  int stride;
  uint8_t bytes_per_px = 0;
  const uint8_t assoc_alpha = 0;
  // For non-alpha case, we omit tag 0x152 (ExtraSamples).
  const uint8_t num_ifd_entries = 0;
  uint8_t tiff_header[TIFF_HEADER_SIZE] = {
    0x49, 0x49, 0x2a, 0x00,   // little endian signature
    8, 0, 0, 0,               // offset to the unique IFD that follows
    // IFD (offset = 8). Entries must be written in increasing tag order.
    num_ifd_entries, 0,       // Number of entries in the IFD (12 bytes each).
    0x00, 0x01, 3, 0, 1, 0, 0, 0, 0, 0, 0, 0,    //  10: Width  (TBD)
    0x01, 0x01, 3, 0, 1, 0, 0, 0, 0, 0, 0, 0,    //  22: Height (TBD)
    0x02, 0x01, 3, 0, bytes_per_px, 0, 0, 0,     //  34: BitsPerSample: 8888
        EXTRA_DATA_OFFSET + 0, 0, 0, 0,
    0x03, 0x01, 3, 0, 1, 0, 0, 0, 1, 0, 0, 0,    //  46: Compression: none
    0x06, 0x01, 3, 0, 1, 0, 0, 0, 2, 0, 0, 0,    //  58: Photometric: RGB
    0x11, 0x01, 4, 0, 1, 0, 0, 0,                //  70: Strips offset:
        TIFF_HEADER_SIZE, 0, 0, 0,               //      data follows header
    0x12, 0x01, 3, 0, 1, 0, 0, 0, 1, 0, 0, 0,    //  82: Orientation: topleft
    0x15, 0x01, 3, 0, 1, 0, 0, 0,                //  94: SamplesPerPixels
        bytes_per_px, 0, 0, 0,
    0x16, 0x01, 3, 0, 1, 0, 0, 0, 0, 0, 0, 0,    // 106: Rows per strip (TBD)
    0x17, 0x01, 4, 0, 1, 0, 0, 0, 0, 0, 0, 0,    // 118: StripByteCount (TBD)
    0x1a, 0x01, 5, 0, 1, 0, 0, 0,                // 130: X-resolution
        EXTRA_DATA_OFFSET + 8, 0, 0, 0,
    0x1b, 0x01, 5, 0, 1, 0, 0, 0,                // 142: Y-resolution
        EXTRA_DATA_OFFSET + 8, 0, 0, 0,
    0x1c, 0x01, 3, 0, 1, 0, 0, 0, 1, 0, 0, 0,    // 154: PlanarConfiguration
    0x28, 0x01, 3, 0, 1, 0, 0, 0, 2, 0, 0, 0,    // 166: ResolutionUnit (inch)
    0x52, 0x01, 3, 0, 1, 0, 0, 0,
        assoc_alpha, 0, 0, 0,                    // 178: ExtraSamples: rgbA/RGBA
    0, 0, 0, 0,                                  // 190: IFD terminator
    // EXTRA_DATA_OFFSET:
    8, 0, 8, 0, 8, 0, 8, 0,      // BitsPerSample
    72, 0, 0, 0, 1, 0, 0, 0      // 72 pixels/inch, for X/Y-resolution
  };
  uint32_t y;

  if (fout == NULL || buffer == NULL) return 0;

  has_alpha = WebPIsAlphaMode(buffer->colorspace);
  width = buffer->width;
  height = buffer->height;
  rgba = buffer->u.RGBA.rgba;
  stride = buffer->u.RGBA.stride;

  if (rgba == NULL) return 0;

  // Update bytes_per_px, num_ifd_entries and assoc_alpha.
  tiff_header[38] = tiff_header[102] = bytes_per_px = has_alpha ? 4 : 3;
  tiff_header[8] = has_alpha ? NUM_IFD_ENTRIES : NUM_IFD_ENTRIES - 1;
  tiff_header[186] = WebPIsPremultipliedMode(buffer->colorspace) ? 1 : 2;

  // Fill placeholders in IFD:
  PutLE32(tiff_header + 10 + 8, width);
  PutLE32(tiff_header + 22 + 8, height);
  PutLE32(tiff_header + 106 + 8, height);
  PutLE32(tiff_header + 118 + 8, width * bytes_per_px * height);
  if (!has_alpha) PutLE32(tiff_header + 178, 0);  // IFD terminator

  // write header
  if (fwrite(tiff_header, sizeof(tiff_header), 1, fout) != 1) {
    return 0;
  }
  // write pixel values
  for (y = 0; y < height; ++y) {
    if (fwrite(rgba, bytes_per_px, width, fout) != width) {
      return 0;
    }
    rgba += stride;
  }

  return 1;
}